

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_icc.c
# Opt level: O3

char * jas_iccsigtostr(int sig,char *buf)

{
  ushort **ppuVar1;
  char *pcVar2;
  uint uVar3;
  
  uVar3 = 5;
  ppuVar1 = __ctype_b_loc();
  pcVar2 = buf;
  do {
    if ((*(byte *)((long)*ppuVar1 + (ulong)((uint)sig >> 0x18) * 2 + 1) & 0xc) != 0) {
      *pcVar2 = (char)((uint)sig >> 0x18);
      pcVar2 = pcVar2 + 1;
    }
    sig = sig << 8;
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  *pcVar2 = '\0';
  return buf;
}

Assistant:

static char *jas_iccsigtostr(int sig, char *buf)
{
	int n;
	int c;
	char *bufptr;
	bufptr = buf;
	for (n = 4; n > 0; --n) {
		c = (sig >> 24) & 0xff;
		if (isalpha(c) || isdigit(c)) {
			*bufptr++ = c;
		}
		sig <<= 8;
	}
	*bufptr = '\0';
	return buf;
}